

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp.cpp
# Opt level: O2

ll fastexp(ll a,ll p,ll mod)

{
  long lVar1;
  long lVar2;
  
  lVar2 = a % mod + mod;
  lVar1 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1)) % SEXT816(mod),0);
  for (; lVar2 = lVar2 % mod, p != 0; p = p / 2) {
    if ((p & 1U) != 0) {
      lVar1 = (lVar1 * lVar2) % mod;
    }
    lVar2 = lVar2 * lVar2;
  }
  return lVar1;
}

Assistant:

ll fastexp(ll a, ll p, ll mod) {
	a = ((a % mod) + mod) % mod; /// so many mod's because of corner cases
	ll res = 1 % mod;
	for (; p; a = (a * a) % mod, p /= 2)
		if (p % 2)
			res = (res * a) % mod;
	return res;
}